

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

uint64_t __thiscall flexbuffers::Reference::AsUInt64(Reference *this)

{
  uint8_t *puVar1;
  char *s;
  double dVar2;
  Sized local_48;
  String local_30;
  Reference *local_18;
  Reference *this_local;
  
  local_18 = this;
  if (this->type_ == FBT_UINT) {
    this_local = (Reference *)ReadUInt64(this->data_,this->parent_width_);
  }
  else {
    switch(this->type_) {
    case FBT_NULL:
      this_local = (Reference *)0x0;
      break;
    case FBT_INT:
      this_local = (Reference *)ReadInt64(this->data_,this->parent_width_);
      break;
    default:
      this_local = (Reference *)0x0;
      break;
    case FBT_FLOAT:
      dVar2 = ReadDouble(this->data_,this->parent_width_);
      this_local = (Reference *)
                   ((long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f);
      break;
    case FBT_STRING:
      AsString(&local_30,this);
      s = String::c_str(&local_30);
      this_local = (Reference *)flatbuffers::StringToUInt(s,10);
      break;
    case FBT_INDIRECT_INT:
      puVar1 = Indirect(this);
      this_local = (Reference *)ReadInt64(puVar1,this->byte_width_);
      break;
    case FBT_INDIRECT_UINT:
      puVar1 = Indirect(this);
      this_local = (Reference *)ReadUInt64(puVar1,this->byte_width_);
      break;
    case FBT_INDIRECT_FLOAT:
      puVar1 = Indirect(this);
      dVar2 = ReadDouble(puVar1,this->byte_width_);
      this_local = (Reference *)
                   ((long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f);
      break;
    case FBT_VECTOR:
      AsVector((Vector *)&local_48,this);
      this_local = (Reference *)Sized::size(&local_48);
      break;
    case FBT_BOOL:
      this_local = (Reference *)ReadUInt64(this->data_,this->parent_width_);
    }
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t AsUInt64() const {
    if (type_ == FBT_UINT) {
      // A fast path for the common case.
      return ReadUInt64(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_UINT: return ReadUInt64(Indirect(), byte_width_);
        case FBT_INT: return ReadInt64(data_, parent_width_);
        case FBT_INDIRECT_INT: return ReadInt64(Indirect(), byte_width_);
        case FBT_FLOAT:
          return static_cast<uint64_t>(ReadDouble(data_, parent_width_));
        case FBT_INDIRECT_FLOAT:
          return static_cast<uint64_t>(ReadDouble(Indirect(), byte_width_));
        case FBT_NULL: return 0;
        case FBT_STRING: return flatbuffers::StringToUInt(AsString().c_str());
        case FBT_VECTOR: return static_cast<uint64_t>(AsVector().size());
        case FBT_BOOL: return ReadUInt64(data_, parent_width_);
        default:
          // Convert other things to uint.
          return 0;
      }
  }